

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

char * mz_zip_get_error_string(mz_zip_error mz_err)

{
  char *pcStack_10;
  mz_zip_error mz_err_local;
  
  switch(mz_err) {
  case MZ_ZIP_NO_ERROR:
    pcStack_10 = "no error";
    break;
  case MZ_ZIP_UNDEFINED_ERROR:
    pcStack_10 = "undefined error";
    break;
  case MZ_ZIP_TOO_MANY_FILES:
    pcStack_10 = "too many files";
    break;
  case MZ_ZIP_FILE_TOO_LARGE:
    pcStack_10 = "file too large";
    break;
  case MZ_ZIP_UNSUPPORTED_METHOD:
    pcStack_10 = "unsupported method";
    break;
  case MZ_ZIP_UNSUPPORTED_ENCRYPTION:
    pcStack_10 = "unsupported encryption";
    break;
  case MZ_ZIP_UNSUPPORTED_FEATURE:
    pcStack_10 = "unsupported feature";
    break;
  case MZ_ZIP_FAILED_FINDING_CENTRAL_DIR:
    pcStack_10 = "failed finding central directory";
    break;
  case MZ_ZIP_NOT_AN_ARCHIVE:
    pcStack_10 = "not a ZIP archive";
    break;
  case MZ_ZIP_INVALID_HEADER_OR_CORRUPTED:
    pcStack_10 = "invalid header or archive is corrupted";
    break;
  case MZ_ZIP_UNSUPPORTED_MULTIDISK:
    pcStack_10 = "unsupported multidisk archive";
    break;
  case MZ_ZIP_DECOMPRESSION_FAILED:
    pcStack_10 = "decompression failed or archive is corrupted";
    break;
  case MZ_ZIP_COMPRESSION_FAILED:
    pcStack_10 = "compression failed";
    break;
  case MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE:
    pcStack_10 = "unexpected decompressed size";
    break;
  case MZ_ZIP_CRC_CHECK_FAILED:
    pcStack_10 = "CRC-32 check failed";
    break;
  case MZ_ZIP_UNSUPPORTED_CDIR_SIZE:
    pcStack_10 = "unsupported central directory size";
    break;
  case MZ_ZIP_ALLOC_FAILED:
    pcStack_10 = "allocation failed";
    break;
  case MZ_ZIP_FILE_OPEN_FAILED:
    pcStack_10 = "file open failed";
    break;
  case MZ_ZIP_FILE_CREATE_FAILED:
    pcStack_10 = "file create failed";
    break;
  case MZ_ZIP_FILE_WRITE_FAILED:
    pcStack_10 = "file write failed";
    break;
  case MZ_ZIP_FILE_READ_FAILED:
    pcStack_10 = "file read failed";
    break;
  case MZ_ZIP_FILE_CLOSE_FAILED:
    pcStack_10 = "file close failed";
    break;
  case MZ_ZIP_FILE_SEEK_FAILED:
    pcStack_10 = "file seek failed";
    break;
  case MZ_ZIP_FILE_STAT_FAILED:
    pcStack_10 = "file stat failed";
    break;
  case MZ_ZIP_INVALID_PARAMETER:
    pcStack_10 = "invalid parameter";
    break;
  case MZ_ZIP_INVALID_FILENAME:
    pcStack_10 = "invalid filename";
    break;
  case MZ_ZIP_BUF_TOO_SMALL:
    pcStack_10 = "buffer too small";
    break;
  case MZ_ZIP_INTERNAL_ERROR:
    pcStack_10 = "internal error";
    break;
  case MZ_ZIP_FILE_NOT_FOUND:
    pcStack_10 = "file not found";
    break;
  case MZ_ZIP_ARCHIVE_TOO_LARGE:
    pcStack_10 = "archive is too large";
    break;
  case MZ_ZIP_VALIDATION_FAILED:
    pcStack_10 = "validation failed";
    break;
  case MZ_ZIP_WRITE_CALLBACK_FAILED:
    pcStack_10 = "write calledback failed";
    break;
  default:
    pcStack_10 = "unknown error";
  }
  return pcStack_10;
}

Assistant:

const char *mz_zip_get_error_string(mz_zip_error mz_err)
{
    switch (mz_err)
    {
        case MZ_ZIP_NO_ERROR:
            return "no error";
        case MZ_ZIP_UNDEFINED_ERROR:
            return "undefined error";
        case MZ_ZIP_TOO_MANY_FILES:
            return "too many files";
        case MZ_ZIP_FILE_TOO_LARGE:
            return "file too large";
        case MZ_ZIP_UNSUPPORTED_METHOD:
            return "unsupported method";
        case MZ_ZIP_UNSUPPORTED_ENCRYPTION:
            return "unsupported encryption";
        case MZ_ZIP_UNSUPPORTED_FEATURE:
            return "unsupported feature";
        case MZ_ZIP_FAILED_FINDING_CENTRAL_DIR:
            return "failed finding central directory";
        case MZ_ZIP_NOT_AN_ARCHIVE:
            return "not a ZIP archive";
        case MZ_ZIP_INVALID_HEADER_OR_CORRUPTED:
            return "invalid header or archive is corrupted";
        case MZ_ZIP_UNSUPPORTED_MULTIDISK:
            return "unsupported multidisk archive";
        case MZ_ZIP_DECOMPRESSION_FAILED:
            return "decompression failed or archive is corrupted";
        case MZ_ZIP_COMPRESSION_FAILED:
            return "compression failed";
        case MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE:
            return "unexpected decompressed size";
        case MZ_ZIP_CRC_CHECK_FAILED:
            return "CRC-32 check failed";
        case MZ_ZIP_UNSUPPORTED_CDIR_SIZE:
            return "unsupported central directory size";
        case MZ_ZIP_ALLOC_FAILED:
            return "allocation failed";
        case MZ_ZIP_FILE_OPEN_FAILED:
            return "file open failed";
        case MZ_ZIP_FILE_CREATE_FAILED:
            return "file create failed";
        case MZ_ZIP_FILE_WRITE_FAILED:
            return "file write failed";
        case MZ_ZIP_FILE_READ_FAILED:
            return "file read failed";
        case MZ_ZIP_FILE_CLOSE_FAILED:
            return "file close failed";
        case MZ_ZIP_FILE_SEEK_FAILED:
            return "file seek failed";
        case MZ_ZIP_FILE_STAT_FAILED:
            return "file stat failed";
        case MZ_ZIP_INVALID_PARAMETER:
            return "invalid parameter";
        case MZ_ZIP_INVALID_FILENAME:
            return "invalid filename";
        case MZ_ZIP_BUF_TOO_SMALL:
            return "buffer too small";
        case MZ_ZIP_INTERNAL_ERROR:
            return "internal error";
        case MZ_ZIP_FILE_NOT_FOUND:
            return "file not found";
        case MZ_ZIP_ARCHIVE_TOO_LARGE:
            return "archive is too large";
        case MZ_ZIP_VALIDATION_FAILED:
            return "validation failed";
        case MZ_ZIP_WRITE_CALLBACK_FAILED:
            return "write calledback failed";
        default:
            break;
    }

    return "unknown error";
}